

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# nfsubs.cpp
# Opt level: O0

UBool __thiscall icu_63::NFSubstitution::operator==(NFSubstitution *this,NFSubstitution *rhs)

{
  bool bVar1;
  int iVar2;
  uint local_28;
  bool local_21;
  NFSubstitution *rhs_local;
  NFSubstitution *this_local;
  
  if (this == (NFSubstitution *)0x0) {
    __cxa_bad_typeid();
  }
  bVar1 = std::type_info::operator==
                    ((type_info *)(this->super_UObject)._vptr_UObject[-1],
                     (type_info *)(rhs->super_UObject)._vptr_UObject[-1]);
  local_21 = false;
  if (((bVar1) && (local_21 = false, this->pos == rhs->pos)) &&
     (local_21 = false, (this->ruleSet == (NFRuleSet *)0x0) == (rhs->ruleSet == (NFRuleSet *)0x0)))
  {
    if (this->numberFormat == (DecimalFormat *)0x0) {
      local_28 = (uint)(rhs->numberFormat == (DecimalFormat *)0x0);
    }
    else {
      iVar2 = (*(this->numberFormat->super_NumberFormat).super_Format.super_UObject._vptr_UObject[3]
              )(this->numberFormat,rhs->numberFormat);
      local_28 = (uint)(char)iVar2;
    }
    local_21 = local_28 != 0;
  }
  return local_21;
}

Assistant:

UBool
NFSubstitution::operator==(const NFSubstitution& rhs) const
{
  // compare class and all of the fields all substitutions have
  // in common
  // this should be called by subclasses before their own equality tests
  return typeid(*this) == typeid(rhs)
  && pos == rhs.pos
  && (ruleSet == NULL) == (rhs.ruleSet == NULL)
  // && ruleSet == rhs.ruleSet causes circularity, other checks to make instead?
  && (numberFormat == NULL
      ? (rhs.numberFormat == NULL)
      : (*numberFormat == *rhs.numberFormat));
}